

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  istream *piVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  bool bVar5;
  double value;
  String buffer;
  IStringStream is;
  ValueHolder local_238;
  long local_230;
  size_type local_228;
  long lStack_220;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,token->start_,token->end_);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_1d0,_S_in);
  piVar1 = std::istream::_M_extract<double>((double *)local_1b0);
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    Value::Value((Value *)&local_238,0.0);
    Value::operator=(decoded,(Value *)&local_238);
    Value::~Value((Value *)&local_238);
    bVar5 = true;
  }
  else {
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,token->start_,token->end_);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1f0,0,(char *)0x0,0x7e3908);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_200 = *plVar3;
      lStack_1f8 = plVar2[3];
      local_210 = &local_200;
    }
    else {
      local_200 = *plVar3;
      local_210 = (long *)*plVar2;
    }
    local_208 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      local_228 = *psVar4;
      lStack_220 = plVar2[3];
      local_238.string_ = (char *)&local_228;
    }
    else {
      local_228 = *psVar4;
      local_238.string_ = ((char *)*plVar2).string_;
    }
    local_230 = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    addError(this,(String *)&local_238,token,(Location)0x0);
    if (local_238 != &local_228) {
      operator_delete(local_238.string_,local_228 + 1);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    bVar5 = false;
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  return bVar5;
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const String buffer(token.start_, token.end_);
  IStringStream is(buffer);
  if (!(is >> value)) {
    if (value == std::numeric_limits<double>::max())
      value = std::numeric_limits<double>::infinity();
    else if (value == std::numeric_limits<double>::lowest())
      value = -std::numeric_limits<double>::infinity();
    else if (!std::isinf(value))
      return addError(
        "'" + String(token.start_, token.end_) + "' is not a number.", token);
  }
  decoded = value;
  return true;
}